

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O3

void __thiscall
OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::GBAtypeParameters> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__GenericData_002f7570;
  pcVar2 = (this->super_GenericData).id_._M_dataplus._M_p;
  paVar1 = &(this->super_GenericData).id_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}